

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wabtapi.cc
# Opt level: O2

Var write_commands(Context *ctx,Script *script)

{
  Var *this;
  pointer puVar1;
  __uniq_ptr_data<wabt::Command,_std::default_delete<wabt::Command>,_true,_true> base;
  Var obj;
  Var value;
  char *cmdObj;
  ModuleCommand *pMVar2;
  AssertTrapCommandBase<(wabt::CommandType)11> *pAVar3;
  ActionCommandBase<(wabt::CommandType)8> *pAVar4;
  RegisterCommand *pRVar5;
  AssertReturnCommand *pAVar6;
  AssertModuleCommand<(wabt::CommandType)3> *pAVar7;
  AssertTrapCommandBase<(wabt::CommandType)10> *pAVar8;
  char *pcVar9;
  string *src;
  int __c;
  PropertyId id;
  ulong uVar10;
  int local_34;
  
  obj = (*ctx->chakra->spec->createObject)(ctx->chakra->user_data);
  value = (*ctx->chakra->spec->createArray)(ctx->chakra->user_data);
  set_property(ctx,obj,4,value,"Unable to set commands");
  local_34 = -1;
  uVar10 = 0;
  do {
    puVar1 = (script->commands).
             super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(script->commands).
                      super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3) <= uVar10) {
      return obj;
    }
    base.super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
    super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl =
         puVar1[uVar10]._M_t.
         super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>;
    cmdObj = (char *)(*ctx->chakra->spec->createObject)(ctx->chakra->user_data);
    (*ctx->chakra->spec->push)(value,cmdObj,ctx->chakra->user_data);
    write_command_type(ctx,*(CommandType *)
                            ((long)base.
                                   super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>
                                   .super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl + 8),
                       cmdObj);
    switch(*(CommandType *)
            ((long)base.super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
                   _M_t.super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>
                   .super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl + 8)) {
    case First:
      pMVar2 = wabt::cast<wabt::ModuleCommand,wabt::Command>
                         ((Command *)
                          base.
                          super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>
                          .super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl);
      write_location(ctx,cmdObj,&(pMVar2->module).loc);
      if ((pMVar2->module).name._M_string_length != 0) {
        write_string(ctx,cmdObj,8,&(pMVar2->module).name);
      }
      write_module(ctx,cmdObj,&pMVar2->module,true);
      local_34 = (int)uVar10;
      break;
    case Action:
      pAVar3 = (AssertTrapCommandBase<(wabt::CommandType)11> *)
               wabt::cast<wabt::ActionCommandBase<(wabt::CommandType)1>,wabt::Command>
                         ((Command *)
                          base.
                          super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>
                          .super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl);
      goto LAB_00d76fc2;
    case Register:
      pRVar5 = wabt::cast<wabt::RegisterCommand,wabt::Command>
                         ((Command *)
                          base.
                          super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>
                          .super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl);
      this = &pRVar5->var;
      pcVar9 = cmdObj;
      write_location(ctx,cmdObj,&this->loc);
      if ((pRVar5->var).type_ == Name) {
        write_var(ctx,cmdObj,8,this);
      }
      else {
        pcVar9 = wabt::Var::index(this,pcVar9,__c);
        if ((int)pcVar9 != local_34) {
          __assert_fail("register_command->var.index() == last_module_index",
                        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/chakra/wabtapi.cc"
                        ,0x184,"Js::Var write_commands(Context *, Script *)");
        }
      }
      src = &pRVar5->module_name;
      id = 0;
      goto LAB_00d770b8;
    case AssertMalformed:
      pAVar7 = wabt::cast<wabt::AssertModuleCommand<(wabt::CommandType)3>,wabt::Command>
                         ((Command *)
                          base.
                          super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>
                          .super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl);
      goto LAB_00d76ffe;
    case AssertInvalid:
      pAVar7 = (AssertModuleCommand<(wabt::CommandType)3> *)
               wabt::cast<wabt::AssertModuleCommand<(wabt::CommandType)4>,wabt::Command>
                         ((Command *)
                          base.
                          super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>
                          .super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl);
      goto LAB_00d76ffe;
    case AssertUnlinkable:
      pAVar7 = (AssertModuleCommand<(wabt::CommandType)3> *)
               wabt::cast<wabt::AssertModuleCommand<(wabt::CommandType)5>,wabt::Command>
                         ((Command *)
                          base.
                          super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>
                          .super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl);
      goto LAB_00d76ffe;
    case AssertUninstantiable:
      pAVar7 = (AssertModuleCommand<(wabt::CommandType)3> *)
               wabt::cast<wabt::AssertModuleCommand<(wabt::CommandType)6>,wabt::Command>
                         ((Command *)
                          base.
                          super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>
                          .super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl);
LAB_00d76ffe:
      write_invalid_module
                (ctx,cmdObj,
                 (pAVar7->module)._M_t.
                 super___uniq_ptr_impl<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wabt::ScriptModule_*,_std::default_delete<wabt::ScriptModule>_>
                 .super__Head_base<0UL,_wabt::ScriptModule_*,_false>._M_head_impl,&pAVar7->text);
      break;
    case AssertReturn:
      pAVar6 = wabt::cast<wabt::AssertReturnCommand,wabt::Command>
                         ((Command *)
                          base.
                          super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>
                          .super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl);
      write_location(ctx,cmdObj,
                     &((pAVar6->action)._M_t.
                       super___uniq_ptr_impl<wabt::Action,_std::default_delete<wabt::Action>_>._M_t.
                       super__Tuple_impl<0UL,_wabt::Action_*,_std::default_delete<wabt::Action>_>.
                       super__Head_base<0UL,_wabt::Action_*,_false>._M_head_impl)->loc);
      write_action(ctx,cmdObj,&pAVar6->action);
      write_const_vector(ctx,cmdObj,5,&pAVar6->expected);
      break;
    case AssertReturnCanonicalNan:
      pAVar4 = wabt::cast<wabt::ActionCommandBase<(wabt::CommandType)8>,wabt::Command>
                         ((Command *)
                          base.
                          super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>
                          .super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl);
      goto LAB_00d77060;
    case AssertReturnArithmeticNan:
      pAVar4 = (ActionCommandBase<(wabt::CommandType)8> *)
               wabt::cast<wabt::ActionCommandBase<(wabt::CommandType)9>,wabt::Command>
                         ((Command *)
                          base.
                          super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>
                          .super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl);
LAB_00d77060:
      write_location(ctx,cmdObj,
                     &((pAVar4->action)._M_t.
                       super___uniq_ptr_impl<wabt::Action,_std::default_delete<wabt::Action>_>._M_t.
                       super__Tuple_impl<0UL,_wabt::Action_*,_std::default_delete<wabt::Action>_>.
                       super__Head_base<0UL,_wabt::Action_*,_false>._M_head_impl)->loc);
      write_action(ctx,cmdObj,&pAVar4->action);
      write_action_result_type(ctx,cmdObj,5,script,&pAVar4->action);
      break;
    case AssertTrap:
      pAVar8 = wabt::cast<wabt::AssertTrapCommandBase<(wabt::CommandType)10>,wabt::Command>
                         ((Command *)
                          base.
                          super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>
                          .super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl);
      write_location(ctx,cmdObj,
                     &((pAVar8->action)._M_t.
                       super___uniq_ptr_impl<wabt::Action,_std::default_delete<wabt::Action>_>._M_t.
                       super__Tuple_impl<0UL,_wabt::Action_*,_std::default_delete<wabt::Action>_>.
                       super__Head_base<0UL,_wabt::Action_*,_false>._M_head_impl)->loc);
      write_action(ctx,cmdObj,&pAVar8->action);
      src = &pAVar8->text;
      id = 10;
LAB_00d770b8:
      write_string(ctx,cmdObj,id,src);
      break;
    case AssertExhaustion:
      pAVar3 = wabt::cast<wabt::AssertTrapCommandBase<(wabt::CommandType)11>,wabt::Command>
                         ((Command *)
                          base.
                          super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>
                          .super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl);
LAB_00d76fc2:
      write_location(ctx,cmdObj,
                     &((pAVar3->action)._M_t.
                       super___uniq_ptr_impl<wabt::Action,_std::default_delete<wabt::Action>_>._M_t.
                       super__Tuple_impl<0UL,_wabt::Action_*,_std::default_delete<wabt::Action>_>.
                       super__Head_base<0UL,_wabt::Action_*,_false>._M_head_impl)->loc);
      write_action(ctx,cmdObj,&pAVar3->action);
    }
    uVar10 = (ulong)((int)uVar10 + 1);
  } while( true );
}

Assistant:

Js::Var write_commands(Context* ctx, Script* script)
{

    Js::Var resultObj = ctx->chakra->spec->createObject(ctx->chakra->user_data);
    Js::Var commandsArr = ctx->chakra->spec->createArray(ctx->chakra->user_data);
    set_property(ctx, resultObj, PropertyIds::commands, commandsArr, "Unable to set commands");
    wabt::Index last_module_index = (wabt::Index) - 1;
    for (wabt::Index i = 0; i < script->commands.size(); ++i)
    {
        const Command* command = script->commands[i].get();

        Js::Var cmdObj = ctx->chakra->spec->createObject(ctx->chakra->user_data);
        ctx->chakra->spec->push(commandsArr, cmdObj, ctx->chakra->user_data);
        write_command_type(ctx, command->type, cmdObj);

        switch (command->type)
        {
        case CommandType::Module:
        {
            const Module& module = cast<ModuleCommand>(command)->module;
            write_location(ctx, cmdObj, &module.loc);
            if (!module.name.empty())
            {
                write_string(ctx, cmdObj, PropertyIds::name, module.name);
            }
            write_module(ctx, cmdObj, &module);
            last_module_index = i;
            break;
        }

        case CommandType::Action:
        {
            const ActionPtr& action = cast<ActionCommand>(command)->action;
            write_location(ctx, cmdObj, &action->loc);
            write_action(ctx, cmdObj, action);
            break;
        }
        case CommandType::Register:
        {
            auto* register_command = cast<RegisterCommand>(command);
            write_location(ctx, cmdObj, &register_command->var.loc);
            if (register_command->var.is_name())
            {
                write_var(ctx, cmdObj, PropertyIds::name, &register_command->var);
            }
            else
            {
                /* If we're not registering by name, then we should only be
                * registering the last module. */
                WABT_USE(last_module_index);
                assert(register_command->var.index() == last_module_index);
            }
            write_string(ctx, cmdObj, PropertyIds::as, register_command->module_name);
            break;
        }
        case CommandType::AssertMalformed:
        {
            auto* assert_malformed_command = cast<AssertMalformedCommand>(command);
            write_invalid_module(ctx, cmdObj, assert_malformed_command->module.get(),
                assert_malformed_command->text);
            break;
        }
        case CommandType::AssertInvalid:
        {
            auto* assert_invalid_command = cast<AssertInvalidCommand>(command);
            write_invalid_module(ctx, cmdObj, assert_invalid_command->module.get(),
                assert_invalid_command->text);
            break;
        }
        case CommandType::AssertUnlinkable:
        {
            auto* assert_unlinkable_command = cast<AssertUnlinkableCommand>(command);
            write_invalid_module(ctx, cmdObj, assert_unlinkable_command->module.get(),
                assert_unlinkable_command->text);
            break;
        }
        case CommandType::AssertUninstantiable:
        {
            auto* assert_uninstantiable_command = cast<AssertUninstantiableCommand>(command);
            write_invalid_module(ctx, cmdObj, assert_uninstantiable_command->module.get(),
                assert_uninstantiable_command->text);
            break;
        }
        case CommandType::AssertReturn:
        {
            auto* assert_return_command = cast<AssertReturnCommand>(command);
            write_location(ctx, cmdObj, &assert_return_command->action->loc);
            write_action(ctx, cmdObj, assert_return_command->action);
            write_const_vector(ctx, cmdObj, PropertyIds::expected, assert_return_command->expected);
            break;
        }
        case CommandType::AssertReturnCanonicalNan:
        {
            auto* assert_return_canonical_nan_command = cast<AssertReturnCanonicalNanCommand>(command);
            write_location(ctx, cmdObj, &assert_return_canonical_nan_command->action->loc);
            write_action(ctx, cmdObj, assert_return_canonical_nan_command->action);
            write_action_result_type(ctx, cmdObj, PropertyIds::expected, script,
                assert_return_canonical_nan_command->action);
            break;
        }
        case CommandType::AssertReturnArithmeticNan:
        {
            auto* assert_return_arithmetic_nan_command = cast<AssertReturnArithmeticNanCommand>(command);
            write_location(ctx, cmdObj, &assert_return_arithmetic_nan_command->action->loc);
            write_action(ctx, cmdObj, assert_return_arithmetic_nan_command->action);
            write_action_result_type(ctx, cmdObj, PropertyIds::expected, script,
                assert_return_arithmetic_nan_command->action);
            break;
        }
        case CommandType::AssertTrap:
        {
            auto* assert_trap_command = cast<AssertTrapCommand>(command);
            write_location(ctx, cmdObj, &assert_trap_command->action->loc);
            write_action(ctx, cmdObj, assert_trap_command->action);
            write_string(ctx, cmdObj, PropertyIds::text, assert_trap_command->text);
            break;
        }
        case CommandType::AssertExhaustion:
        {
            auto* assert_exhaustion_command = cast<AssertExhaustionCommand>(command);
            write_location(ctx, cmdObj, &assert_exhaustion_command->action->loc);
            write_action(ctx, cmdObj, assert_exhaustion_command->action);
            break;
        }
        }
    }
    return resultObj;
}